

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void str_clean_whitespaces_simple(char *str_in)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  char *pcVar5;
  
  pcVar5 = str_in + -1;
  do {
    pcVar1 = pcVar5 + 1;
    pcVar5 = pcVar5 + 1;
  } while (*pcVar1 == ' ');
  do {
    pcVar1 = pcVar5;
    bVar4 = true;
    do {
      bVar3 = bVar4;
      pcVar5 = pcVar1;
      cVar2 = *pcVar5;
      if (!bVar3) break;
      pcVar1 = pcVar5 + 1;
      bVar4 = false;
    } while (cVar2 == ' ');
    if (cVar2 == '\0') {
      *str_in = '\0';
    }
    else {
      if (!bVar3) {
        *str_in = ' ';
        str_in = str_in + 1;
      }
      *str_in = *pcVar5;
      str_in = str_in + 1;
      pcVar5 = pcVar5 + 1;
    }
    if (cVar2 == '\0') {
      return;
    }
  } while( true );
}

Assistant:

void str_clean_whitespaces_simple(char *str_in)
{
	char *read = str_in;
	char *write = str_in;

	/* skip initial whitespace */
	while(*read == ' ')
		read++;

	/* end of read string is detected in the loop */
	while(1)
	{
		/* skip whitespace */
		int found_whitespace = 0;
		for(; *read == ' ' && !found_whitespace; read++)
			found_whitespace = 1;
		/* if not at the end of the string, put a found whitespace here */
		if(*read)
		{
			if(found_whitespace)
				*write++ = ' ';
			*write++ = *read++;
		}
		else
		{
			*write = 0;
			break;
		}
	}
}